

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O3

void __thiscall
MinVR::VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5>::
VRDatumSpecialized(VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5>
                   *this,vector<float,_std::allocator<float>_> *inVal)

{
  list<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *this_00;
  size_t *psVar1;
  _Node *p_Var2;
  
  VRDatum::VRDatum(&this->super_VRDatum,VRCORETYPE_FLOATARRAY);
  (this->super_VRDatum)._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_00176e58;
  this_00 = &this->value;
  (this->value).
  super__List_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->value).
  super__List_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->value).
  super__List_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->needPush = false;
  this->pushed = false;
  this->stackFrame = 1;
  p_Var2 = std::__cxx11::
           list<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>
           ::_M_create_node<std::vector<float,std::allocator<float>>const&>
                     ((list<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>
                       *)this_00,inVal);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  psVar1 = &(this->value).
            super__List_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

VRDatumSpecialized(const T inVal):
    VRDatum(TID), needPush(false), pushed(false), stackFrame(1) {
    value.push_front(inVal);
  }